

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::ES5ArrayTypeHandlerBase
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,Recycler *recycler,
          DictionaryTypeHandlerBase<unsigned_short> *typeHandler)

{
  DictionaryTypeHandlerBase<unsigned_short> *this_00;
  Recycler *alloc;
  IndexPropertyDescriptorMap *this_01;
  TrackAllocData local_48;
  DictionaryTypeHandlerBase<unsigned_short> *local_20;
  DictionaryTypeHandlerBase<unsigned_short> *typeHandler_local;
  Recycler *recycler_local;
  ES5ArrayTypeHandlerBase<unsigned_short> *this_local;
  
  local_20 = typeHandler;
  typeHandler_local = (DictionaryTypeHandlerBase<unsigned_short> *)recycler;
  recycler_local = (Recycler *)this;
  DictionaryTypeHandlerBase<unsigned_short>::DictionaryTypeHandlerBase
            (&this->super_DictionaryTypeHandlerBase<unsigned_short>,typeHandler);
  (this->super_DictionaryTypeHandlerBase<unsigned_short>).super_DynamicTypeHandler.
  _vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01e46e88;
  Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::WriteBarrierPtr(&this->indexPropertyMap);
  this_00 = typeHandler_local;
  this->dataItemAttributes = '\a';
  this->lengthWritable = true;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&IndexPropertyDescriptorMap::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
             ,0xed);
  alloc = Memory::Recycler::TrackAllocInfo((Recycler *)this_00,&local_48);
  this_01 = (IndexPropertyDescriptorMap *)new<Memory::Recycler>(0x20,alloc,0x43c4b0);
  IndexPropertyDescriptorMap::IndexPropertyDescriptorMap(this_01,(Recycler *)typeHandler_local);
  Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator=
            (&this->indexPropertyMap,this_01);
  return;
}

Assistant:

ES5ArrayTypeHandlerBase<T>::ES5ArrayTypeHandlerBase(Recycler* recycler, DictionaryTypeHandlerBase<T>* typeHandler)
        : DictionaryTypeHandlerBase<T>(typeHandler), dataItemAttributes(PropertyDynamicTypeDefaults), lengthWritable(true)
    {
        indexPropertyMap = RecyclerNew(recycler, IndexPropertyDescriptorMap, recycler);
    }